

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O2

adios2_error adios2_remove_all_attributes(adios2_io *io)

{
  allocator local_48 [32];
  string local_28;
  
  std::__cxx11::string::string
            ((string *)&local_28,"for adios2_io, in call to adios2_remove_all_attributes",local_48);
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  adios2::core::IO::RemoveAllAttributes();
  return adios2_error_none;
}

Assistant:

adios2_error adios2_remove_all_attributes(adios2_io *io)
{
    try
    {
        adios2::helper::CheckForNullptr(io,
                                        "for adios2_io, in call to adios2_remove_all_attributes");
        reinterpret_cast<adios2::core::IO *>(io)->RemoveAllAttributes();
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_remove_attribute"));
    }
}